

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O1

int64_t duckdb::Time::ToNanoTime(int32_t hour,int32_t minute,int32_t second,int32_t nanoseconds)

{
  return (long)nanoseconds + ((long)second + ((long)minute + (long)hour * 0x3c) * 0x3c) * 1000000000
  ;
}

Assistant:

int64_t Time::ToNanoTime(int32_t hour, int32_t minute, int32_t second, int32_t nanoseconds) {
	int64_t result;
	result = hour;                                           // hours
	result = result * Interval::MINS_PER_HOUR + minute;      // hours -> minutes
	result = result * Interval::SECS_PER_MINUTE + second;    // minutes -> seconds
	result = result * Interval::NANOS_PER_SEC + nanoseconds; // seconds -> nanoseconds
	return result;
}